

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpMessage<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint16_t type_card;
  uint32_t uVar3;
  byte *pbVar4;
  bool bVar5;
  ushort uVar6;
  FieldEntry *entry;
  char *pcVar7;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint *puVar8;
  MessageLite **ppMVar9;
  TcParseTableBase *table_00;
  MessageLite *msg_00;
  string *psVar10;
  uint uVar11;
  size_type sVar12;
  undefined8 uVar13;
  int iVar14;
  Arena *arena;
  pointer pcVar15;
  int iVar16;
  char *local_48 [2];
  undefined4 local_34;
  
  entry = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                    (table,(ulong)data.field_0 >> 0x20);
  type_card = entry->type_card;
  uVar6 = type_card & 0x30;
  if (uVar6 == 0x20) {
    if ((type_card & 0x1c0) == 0x40) {
      pcVar7 = MpRepeatedMessageOrGroup<false,true>(msg,ptr,ctx,data,table,hasbits);
      return pcVar7;
    }
    if ((type_card & 0x1c0) == 0) {
      pcVar7 = MpRepeatedMessageOrGroup<false,false>(msg,ptr,ctx,data,table,hasbits);
      return pcVar7;
    }
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0026a48c;
  }
  uVar11 = data.field_0._0_4_ & 7;
  if ((type_card & 0x1c0) == 0x40) {
    if (uVar11 != 3) goto LAB_0026a46a;
  }
  else if (((type_card & 0x1c0) != 0) || (uVar11 != 2)) {
LAB_0026a46a:
    UNRECOVERED_JUMPTABLE = table->fallback;
LAB_0026a48c:
    pcVar7 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,(TcFieldData)data.field_0,table,hasbits);
    return pcVar7;
  }
  if (uVar6 == 0x30) {
    bVar5 = ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,
                        (ParseContext *)(ulong)uVar11,msg);
  }
  else {
    if (uVar6 == 0x10) {
      pbVar4 = (byte *)((long)&msg->_vptr_MessageLite + ((long)entry->has_idx >> 3));
      *pbVar4 = *pbVar4 | '\x01' << (entry->has_idx & 7U);
    }
    bVar5 = false;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar8 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar8 = *puVar8 | (uint)hasbits;
  }
  ppMVar9 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)entry->offset);
  table_00 = GetTableFromAux(type_card,
                             *(FieldAux *)
                              ((long)&table->has_bits_offset +
                              (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset));
  msg_00 = *ppMVar9;
  if ((bVar5 | msg_00 == (MessageLite *)0x0) == 1) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    msg_00 = ClassData::New(table_00->class_data,arena);
    *ppMVar9 = msg_00;
  }
  if ((type_card & 0x1c0) == 0x40) {
    iVar14 = ctx->depth_;
    iVar16 = iVar14 + -1;
    ctx->depth_ = iVar16;
    if (0 < iVar14) {
      iVar14 = ctx->group_depth_ + 1;
      ctx->group_depth_ = iVar14;
      pcVar7 = ParseLoopPreserveNone(msg_00,ptr,ctx,table_00);
      if (pcVar7 == (char *)0x0) {
LAB_0026a5b6:
        uVar1 = ctx->depth_;
        uVar2 = ctx->group_depth_;
        ctx->depth_ = uVar1 + 1;
        ctx->group_depth_ = uVar2 + -1;
        uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        if (uVar3 != data.field_0._0_4_) {
          return (char *)0x0;
        }
        return pcVar7;
      }
      psVar10 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (iVar16,ctx->depth_,"old_depth == depth_");
      if (psVar10 == (string *)0x0) {
        psVar10 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                            (iVar14,ctx->group_depth_,"old_group_depth == group_depth_");
        if (psVar10 == (string *)0x0) goto LAB_0026a5b6;
        pcVar15 = (psVar10->_M_dataplus)._M_p;
        sVar12 = psVar10->_M_string_length;
        uVar13 = 0x45c;
      }
      else {
        pcVar15 = (psVar10->_M_dataplus)._M_p;
        sVar12 = psVar10->_M_string_length;
        uVar13 = 0x45b;
      }
LAB_0026a6f8:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                 ,uVar13,sVar12,pcVar15);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_48);
    }
  }
  else {
    local_48[0] = ptr;
    ReadSize(local_48);
    if ((local_48[0] != (char *)0x0) && (0 < ctx->depth_)) {
      EpsCopyInputStream::PushLimit
                ((EpsCopyInputStream *)&stack0xffffffffffffffcc,(char *)ctx,(int)local_48[0]);
      iVar16 = ctx->depth_ + -1;
      ctx->depth_ = iVar16;
      if (local_48[0] != (char *)0x0) {
        pcVar7 = ParseLoopPreserveNone(*ppMVar9,local_48[0],ctx,table_00);
        if ((pcVar7 == (char *)0x0) ||
           (psVar10 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                                (iVar16,ctx->depth_,"old_depth == depth_"), psVar10 == (string *)0x0
           )) {
          ctx->depth_ = ctx->depth_ + 1;
          local_48[0] = (char *)CONCAT44(local_48[0]._4_4_,local_34);
          bVar5 = EpsCopyInputStream::PopLimit
                            (&ctx->super_EpsCopyInputStream,(LimitToken *)local_48);
          if (!bVar5) {
            return (char *)0x0;
          }
          return pcVar7;
        }
        pcVar15 = (psVar10->_M_dataplus)._M_p;
        sVar12 = psVar10->_M_string_length;
        uVar13 = 1099;
        goto LAB_0026a6f8;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMessage(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    const uint16_t rep = type_card & field_layout::kRepMask;
    switch (rep) {
      case field_layout::kRepMessage:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, false>(
            PROTOBUF_TC_PARAM_PASS);
      case field_layout::kRepGroup:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, true>(
            PROTOBUF_TC_PARAM_PASS);
      default:
        PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;
  const uint16_t rep = type_card & field_layout::kRepMask;
  const bool is_group = rep == field_layout::kRepGroup;

  // Validate wiretype:
  switch (rep) {
    case field_layout::kRepMessage:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
        goto fallback;
      }
      break;
    case field_layout::kRepGroup:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
        goto fallback;
      }
      break;
    default: {
    fallback:
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  SyncHasbits(msg, hasbits, table);
  MessageLite*& field = RefAt<MessageLite*>(base, entry.offset);

  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));
  if (need_init || field == nullptr) {
    field = NewMessage(inner_table, msg->GetArena());
  }
  const auto inner_loop = [&](const char* ptr) {
    return ParseLoopPreserveNone(field, ptr, ctx, inner_table);
  };
  return is_group ? ctx->ParseGroupInlined(ptr, decoded_tag, inner_loop)
                  : ctx->ParseLengthDelimitedInlined(ptr, inner_loop);
}